

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_pluginlist.cpp
# Opt level: O2

void __thiscall ON_PlugInRef::Default(ON_PlugInRef *this)

{
  this->m_plugin_type = 0;
  this->m_plugin_platform = 0;
  this->m_plugin_sdk_version = 0;
  this->m_plugin_sdk_service_release = 0;
  (this->m_plugin_id).Data1 = 0;
  (this->m_plugin_id).Data2 = 0;
  (this->m_plugin_id).Data3 = 0;
  (this->m_plugin_id).Data4[0] = '\0';
  (this->m_plugin_id).Data4[1] = '\0';
  (this->m_plugin_id).Data4[2] = '\0';
  (this->m_plugin_id).Data4[3] = '\0';
  (this->m_plugin_id).Data4[4] = '\0';
  (this->m_plugin_id).Data4[5] = '\0';
  (this->m_plugin_id).Data4[6] = '\0';
  (this->m_plugin_id).Data4[7] = '\0';
  ON_wString::Destroy(&this->m_plugin_name);
  ON_wString::Destroy(&this->m_plugin_version);
  ON_wString::Destroy(&this->m_plugin_filename);
  ON_wString::Destroy(&this->m_developer_organization);
  ON_wString::Destroy(&this->m_developer_address);
  ON_wString::Destroy(&this->m_developer_country);
  ON_wString::Destroy(&this->m_developer_phone);
  ON_wString::Destroy(&this->m_developer_email);
  ON_wString::Destroy(&this->m_developer_website);
  ON_wString::Destroy(&this->m_developer_updateurl);
  ON_wString::Destroy(&this->m_developer_fax);
  return;
}

Assistant:

void ON_PlugInRef::Default()
{
  memset(&m_plugin_id,0,sizeof(m_plugin_id));
  m_plugin_type = 0;
  m_plugin_platform = 0;
  m_plugin_sdk_version = 0;
  m_plugin_sdk_service_release = 0;
  m_plugin_name.Destroy();
  m_plugin_version.Destroy();
  m_plugin_filename.Destroy(); // name of executable file

  m_developer_organization.Destroy();
  m_developer_address.Destroy();
  m_developer_country.Destroy();
  m_developer_phone.Destroy();
  m_developer_email.Destroy();
  m_developer_website.Destroy();
  m_developer_updateurl.Destroy();
  m_developer_fax.Destroy();
}